

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::ArgMinMaxState<int,double>,int,double,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (int *adata,AggregateInputData *aggr_input_data,double *bdata,
               ArgMinMaxState<int,_double> *state,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,ValidityMask *avalidity,ValidityMask *bvalidity)

{
  bool bVar1;
  ArgMinMaxState<int,_double> *pAVar2;
  AggregateInputData *in_RSI;
  ulong in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateBinaryInput input;
  ulong local_68;
  ulong idx;
  AggregateBinaryInput *in_stack_ffffffffffffffa8;
  ValidityMask *in_stack_ffffffffffffffb0;
  ValidityMask *in_stack_ffffffffffffffb8;
  
  AggregateBinaryInput::AggregateBinaryInput
            ((AggregateBinaryInput *)&stack0xffffffffffffffa8,in_RSI,(ValidityMask *)input.input,
             input.left_mask);
  bVar1 = ArgMinMaxBase<duckdb::LessThan,_true>::IgnoreNull();
  if ((!bVar1) ||
     ((bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)input.input), bVar1 &&
      (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         (&(input.left_mask)->super_TemplatedValidityMask<unsigned_long>), bVar1))))
  {
    for (local_68 = 0; local_68 < in_R8; local_68 = local_68 + 1) {
      pAVar2 = (ArgMinMaxState<int,_double> *)SelectionVector::get_index(in_R9,local_68);
      SelectionVector::get_index((SelectionVector *)i,local_68);
      ArgMinMaxBase<duckdb::LessThan,true>::
      Operation<int,double,duckdb::ArgMinMaxState<int,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
                (pAVar2,(int *)in_stack_ffffffffffffffb8,(double *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
    }
  }
  else {
    for (idx = 0; idx < in_R8; idx = idx + 1) {
      pAVar2 = (ArgMinMaxState<int,_double> *)SelectionVector::get_index(in_R9,idx);
      SelectionVector::get_index((SelectionVector *)i,idx);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffffa8,idx);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffffa8,idx),
         bVar1)) {
        ArgMinMaxBase<duckdb::LessThan,true>::
        Operation<int,double,duckdb::ArgMinMaxState<int,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
                  (pAVar2,(int *)in_stack_ffffffffffffffb8,(double *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}